

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTrace.c
# Opt level: O3

void Sat_SolverTraceWrite(sat_solver *pSat,int *pBeg,int *pEnd,int fRoot)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  FILE *__s;
  uint uVar4;
  
  __s = (FILE *)pSat->pFile;
  if (__s == (FILE *)0x0) {
    return;
  }
  uVar1 = pSat->nClauses;
  uVar2 = pSat->nRoots;
  pSat->nClauses = uVar1 + 1;
  pSat->nRoots = fRoot + uVar2;
  if (pBeg < pEnd) {
    do {
      uVar4 = *pBeg >> 1;
      uVar3 = ~uVar4;
      if ((*pBeg & 1U) == 0) {
        uVar3 = uVar4 + 1;
      }
      fprintf((FILE *)pSat->pFile," %d",(ulong)uVar3);
      pBeg = (int *)((uint *)pBeg + 1);
    } while (pBeg < pEnd);
    __s = (FILE *)pSat->pFile;
  }
  fwrite(" 0\n",3,1,__s);
  return;
}

Assistant:

void Sat_SolverTraceWrite( sat_solver * pSat, int * pBeg, int * pEnd, int fRoot )
{
    if ( pSat->pFile == NULL )
        return;
    pSat->nClauses++;
    pSat->nRoots += fRoot;
    for ( ; pBeg < pEnd ; pBeg++ )
        fprintf( pSat->pFile, " %d", lit_print(*pBeg) );
    fprintf( pSat->pFile, " 0\n" );
}